

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.h
# Opt level: O3

void __thiscall
bv::internal::bitview<std::vector>::set
          (bitview<std::vector> *this,size_t begin,size_t end,word_type value)

{
  pointer puVar1;
  sbyte sVar2;
  sbyte sVar3;
  char cVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar8;
  ulong uVar9;
  byte bVar10;
  ulong uVar11;
  byte bVar12;
  ulong uVar7;
  
  uVar5 = end - begin;
  if (begin <= end && uVar5 != 0) {
    puVar1 = (this->_container).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar6 = (uint)begin & 0x3f;
    uVar7 = (ulong)uVar6;
    uVar8 = begin >> 6;
    uVar11 = 0x40 - uVar7;
    uVar9 = uVar11;
    if (uVar5 < uVar11) {
      uVar9 = uVar5;
    }
    cVar4 = (char)uVar9;
    bVar12 = 0x40 - (-cVar4 & 0x3fU);
    sVar2 = (bVar12 < 0x41) * ('@' - bVar12);
    puVar1[uVar8] =
         ~(((ulong)(-1L << (-(uVar7 + uVar9) & 0x3f)) >>
           ((ulong)(uVar6 + (0x40 - (int)(uVar7 + uVar9))) & 0x3f)) << uVar7) & puVar1[uVar8] |
         ((value << sVar2) >> sVar2) << uVar7;
    if (uVar11 < uVar5) {
      bVar12 = (char)uVar5 - cVar4;
      uVar7 = 0;
      if (uVar9 != 0x40) {
        uVar7 = (value >> (uVar9 & 0x3f)) << (uVar9 & 0x3f);
      }
      sVar2 = (bVar12 < 0x41) * ('@' - bVar12);
      bVar10 = 0x40 - (cVar4 - (char)uVar5 & 0x3fU);
      sVar3 = (bVar10 < 0x41) * ('@' - bVar10);
      puVar1[uVar8 + 1] =
           ~((ulong)(-1L << sVar2) >> sVar2) & puVar1[uVar8 + 1] |
           ((0xffffffffffffffffU >> ((ulong)(byte)-bVar12 & 0x3f)) << sVar3) >> sVar3 &
           uVar7 >> (uVar9 & 0x3f);
    }
  }
  return;
}

Assistant:

constexpr bool is_empty_range(size_t begin, size_t end) {
            return begin >= end;
        }